

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::ImmutableMessageGenerator::GenerateInterface
          (ImmutableMessageGenerator *this,Printer *printer)

{
  btree_map<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>_>
  *this_00;
  Context *context;
  Descriptor *this_01;
  ushort *puVar1;
  bool bVar2;
  FieldDescriptor *field;
  ImmutableFieldGenerator *pIVar3;
  reference ppVar4;
  OneofGeneratorInfo *pOVar5;
  ClassNameResolver *this_02;
  Descriptor *extraout_RDX;
  Descriptor *extraout_RDX_00;
  Descriptor *pDVar6;
  int i;
  int index;
  string_view text;
  string_view text_00;
  string_view text_01;
  string_view begin_varname;
  string_view text_02;
  string_view text_03;
  string_view text_04;
  iterator iVar7;
  string_view end_varname;
  basic_string_view<char,_std::char_traits<char>_> local_70;
  string local_60;
  iterator local_40;
  
  pDVar6 = (this->super_MessageGenerator).descriptor_;
  context = this->context_;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"OrBuilder",(allocator<char> *)&local_70);
  MaybePrintGeneratedAnnotation<google::protobuf::Descriptor_const>
            (context,printer,pDVar6,true,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  pDVar6 = extraout_RDX;
  if ((this->context_->options_).opensource_runtime == false) {
    text._M_str = "@com.google.protobuf.Internal.ProtoNonnullApi\n";
    text._M_len = 0x2e;
    io::Printer::Print<>(printer,text);
    pDVar6 = extraout_RDX_00;
  }
  this_01 = (this->super_MessageGenerator).descriptor_;
  if (this_01->extension_range_count_ < 1) {
    local_40.node_ =
         (btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo>_>,_256,_false>_>
          *)0x4f9b8b;
    if ((this_01->options_->field_0)._impl_.deprecated_ == false) {
      local_40.node_ =
           (btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo>_>,_256,_false>_>
            *)0x4168cc;
    }
    ExtraMessageOrBuilderInterfaces_abi_cxx11_(&local_60,(java *)this_01,pDVar6);
    puVar1 = (ushort *)(((this->super_MessageGenerator).descriptor_)->all_names_).payload_;
    local_70._M_len = (size_t)*puVar1;
    local_70._M_str = (char *)((long)puVar1 + ~local_70._M_len);
    text_01._M_str =
         "$deprecation$public interface ${$$classname$OrBuilder$}$ extends\n    $extra_interfaces$\n    com.google.protobuf.MessageOrBuilder {\n"
    ;
    text_01._M_len = 0x83;
    io::Printer::
    Print<char[12],char_const*,char[17],std::__cxx11::string,char[10],std::basic_string_view<char,std::char_traits<char>>,char[2],char[1],char[2],char[1]>
              (printer,text_01,(char (*) [12])0x56da69,(char **)&local_40,
               (char (*) [17])"extra_interfaces",&local_60,(char (*) [10])0x475c54,&local_70,
               (char (*) [2])0x489045,(char (*) [1])0x4168cc,(char (*) [2])0x56e49d,
               (char (*) [1])0x4168cc);
  }
  else {
    local_40.node_ =
         (btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo>_>,_256,_false>_>
          *)0x4f9b8b;
    if ((this_01->options_->field_0)._impl_.deprecated_ == false) {
      local_40.node_ =
           (btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo>_>,_256,_false>_>
            *)0x4168cc;
    }
    ExtraMessageOrBuilderInterfaces_abi_cxx11_(&local_60,(java *)this_01,pDVar6);
    puVar1 = (ushort *)(((this->super_MessageGenerator).descriptor_)->all_names_).payload_;
    local_70._M_len = (size_t)*puVar1;
    local_70._M_str = (char *)((long)puVar1 + ~local_70._M_len);
    text_00._M_str =
         "$deprecation$public interface ${$$classname$OrBuilder$}$ extends\n    $extra_interfaces$\n    com.google.protobuf.GeneratedMessage.\n        ExtendableMessageOrBuilder<$classname$> {\n"
    ;
    text_00._M_len = 0xb4;
    io::Printer::
    Print<char[12],char_const*,char[17],std::__cxx11::string,char[10],std::basic_string_view<char,std::char_traits<char>>,char[2],char[1],char[2],char[1]>
              (printer,text_00,(char (*) [12])0x56da69,(char **)&local_40,
               (char (*) [17])"extra_interfaces",&local_60,(char (*) [10])0x475c54,&local_70,
               (char (*) [2])0x489045,(char (*) [1])0x4168cc,(char (*) [2])0x56e49d,
               (char (*) [1])0x4168cc);
  }
  std::__cxx11::string::~string((string *)&local_60);
  begin_varname._M_str = "{";
  begin_varname._M_len = 1;
  end_varname._M_str = "}";
  end_varname._M_len = 1;
  io::Printer::Annotate<google::protobuf::Descriptor>
            (printer,begin_varname,end_varname,(this->super_MessageGenerator).descriptor_,
             (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x0);
  printer->indent_ = printer->indent_ + (printer->options_).spaces_per_indent;
  for (index = 0; index < ((this->super_MessageGenerator).descriptor_)->field_count_;
      index = index + 1) {
    text_02._M_str = "\n";
    text_02._M_len = 1;
    io::Printer::Print<>(printer,text_02);
    field = Descriptor::field((this->super_MessageGenerator).descriptor_,index);
    pIVar3 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::get
                       (&this->field_generators_,field);
    (*(pIVar3->super_FieldGenerator)._vptr_FieldGenerator[7])(pIVar3,printer);
  }
  this_00 = &(this->super_MessageGenerator).oneofs_;
  iVar7 = absl::lts_20250127::container_internal::
          btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
          ::begin((btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
                   *)this_00);
  local_70._M_len = (size_t)iVar7.node_;
  local_70._M_str = (char *)CONCAT44(local_70._M_str._4_4_,iVar7.position_);
  iVar7 = absl::lts_20250127::container_internal::
          btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
          ::end((btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
                 *)this_00);
  local_40.node_ = iVar7.node_;
  local_40.position_ = iVar7.position_;
  while( true ) {
    bVar2 = absl::lts_20250127::container_internal::
            btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
            ::operator!=((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
                          *)&local_70,&local_40);
    if (!bVar2) break;
    ppVar4 = absl::lts_20250127::container_internal::
             btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
             ::operator*((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
                          *)&local_70);
    pOVar5 = Context::GetOneofGeneratorInfo(this->context_,ppVar4->second);
    this_02 = Context::GetNameResolver(this->context_);
    ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
              (&local_60,this_02,(this->super_MessageGenerator).descriptor_);
    text_03._M_str =
         "\n$classname$.$oneof_capitalized_name$Case get$oneof_capitalized_name$Case();\n";
    text_03._M_len = 0x4d;
    io::Printer::Print<char[23],std::__cxx11::string,char[10],std::__cxx11::string>
              (printer,text_03,(char (*) [23])"oneof_capitalized_name",&pOVar5->capitalized_name,
               (char (*) [10])0x475c54,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    absl::lts_20250127::container_internal::
    btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
    ::increment((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
                 *)&local_70);
  }
  io::Printer::Outdent(printer);
  text_04._M_str = "}\n";
  text_04._M_len = 2;
  io::Printer::Print<>(printer,text_04);
  return;
}

Assistant:

void ImmutableMessageGenerator::GenerateInterface(io::Printer* printer) {
  MaybePrintGeneratedAnnotation(context_, printer, descriptor_,
                                /* immutable = */ true, "OrBuilder");
  if (!context_->options().opensource_runtime) {
    printer->Print("@com.google.protobuf.Internal.ProtoNonnullApi\n");
  }
  if (descriptor_->extension_range_count() > 0) {
    printer->Print(
        "$deprecation$public interface ${$$classname$OrBuilder$}$ extends\n"
        "    $extra_interfaces$\n"
        "    com.google.protobuf.GeneratedMessage.\n"
        "        ExtendableMessageOrBuilder<$classname$> {\n",
        "deprecation",
        descriptor_->options().deprecated() ? "@java.lang.Deprecated " : "",
        "extra_interfaces", ExtraMessageOrBuilderInterfaces(descriptor_),
        "classname", descriptor_->name(), "{", "", "}", "");
  } else {
    printer->Print(
        "$deprecation$public interface ${$$classname$OrBuilder$}$ extends\n"
        "    $extra_interfaces$\n"
        "    com.google.protobuf.MessageOrBuilder {\n",
        "deprecation",
        descriptor_->options().deprecated() ? "@java.lang.Deprecated " : "",
        "extra_interfaces", ExtraMessageOrBuilderInterfaces(descriptor_),
        "classname", descriptor_->name(), "{", "", "}", "");
  }
  printer->Annotate("{", "}", descriptor_);

  printer->Indent();
  for (int i = 0; i < descriptor_->field_count(); i++) {
    printer->Print("\n");
    field_generators_.get(descriptor_->field(i))
        .GenerateInterfaceMembers(printer);
  }
  for (const auto& kv : oneofs_) {
    printer->Print(
        "\n"
        "$classname$.$oneof_capitalized_name$Case "
        "get$oneof_capitalized_name$Case();\n",
        "oneof_capitalized_name",
        context_->GetOneofGeneratorInfo(kv.second)->capitalized_name,
        "classname",
        context_->GetNameResolver()->GetImmutableClassName(descriptor_));
  }
  printer->Outdent();

  printer->Print("}\n");
}